

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddqAn<(moira::Instr)121,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  int iVar1;
  u32 uVar2;
  byte bVar3;
  
  bVar3 = 8;
  if ((opcode & 0xe00) != 0) {
    bVar3 = (byte)(opcode >> 9) & 7;
  }
  iVar1 = *(int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  (*this->_vptr_Moira[0x19])(this,4);
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38) = iVar1 - (uint)bVar3;
  return;
}

Assistant:

void
Moira::execAddqAn(u16 opcode)
{
    i8  src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (src == 0) src = 8;
    u32 result = (I == ADDQ) ? readA(dst) + src : readA(dst) - src;
    prefetch<POLLIPL>();

    sync(4);
    writeA(dst, result);
}